

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

wsum_t * __thiscall Clasp::UncoreMinimize::computeSum(UncoreMinimize *this,Solver *s)

{
  SharedData *pSVar1;
  long *__s;
  pointer puVar2;
  SharedData *pSVar3;
  uint uVar4;
  ulong uVar5;
  pointer pLVar6;
  
  pSVar1 = (this->super_MinimizeConstraint).shared_;
  __s = this->sum_;
  uVar5 = (ulong)(pSVar1->adjust_).ebo_.size;
  if (uVar5 != 0) {
    memset(__s,0,uVar5 << 3);
  }
  uVar4 = *(uint *)&pSVar1[1].adjust_.ebo_.buf;
  if (3 < uVar4) {
    pSVar3 = pSVar1 + 1;
    puVar2 = (s->assign_).assign_.ebo_.buf;
    do {
      if ((byte)(*(byte *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc)) & 3) ==
          (byte)(2U - ((uVar4 & 2) == 0))) {
        uVar4 = *(uint *)((long)&(pSVar3->adjust_).ebo_.buf + 4);
        if ((pSVar1->weights).ebo_.size == 0) {
          *__s = *__s + (long)(int)uVar4;
        }
        else {
          pLVar6 = (pSVar1->weights).ebo_.buf + uVar4;
          do {
            __s[*(uint *)pLVar6 & 0x7fffffff] =
                 __s[*(uint *)pLVar6 & 0x7fffffff] + (long)pLVar6->weight;
            uVar4 = *(uint *)pLVar6;
            pLVar6 = pLVar6 + 1;
          } while ((int)uVar4 < 0);
        }
      }
      uVar4 = (pSVar3->adjust_).ebo_.size;
      pSVar3 = (SharedData *)&(pSVar3->adjust_).ebo_.size;
    } while (3 < uVar4);
  }
  return __s;
}

Assistant:

wsum_t* UncoreMinimize::computeSum(const Solver& s) const {
	std::fill_n(sum_, shared_->numRules(), wsum_t(0));
	for (const WeightLiteral* it = shared_->lits; !isSentinel(it->first); ++it) {
		if (s.isTrue(it->first)) { shared_->add(sum_, *it); }
	}
	return sum_;
}